

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Edge * __thiscall
btConvexHullInternal::newEdgePair(btConvexHullInternal *this,Vertex *from,Vertex *to)

{
  Edge *pEVar1;
  Edge *pEVar2;
  Vertex *in_RDX;
  Vertex *in_RSI;
  long in_RDI;
  Edge *r;
  Edge *e;
  
  pEVar1 = Pool<btConvexHullInternal::Edge>::newObject((Pool<btConvexHullInternal::Edge> *)in_RSI);
  pEVar2 = Pool<btConvexHullInternal::Edge>::newObject((Pool<btConvexHullInternal::Edge> *)in_RSI);
  pEVar1->reverse = pEVar2;
  pEVar2->reverse = pEVar1;
  pEVar1->copy = *(int *)(in_RDI + 0xa0);
  pEVar2->copy = *(int *)(in_RDI + 0xa0);
  pEVar1->target = in_RDX;
  pEVar2->target = in_RSI;
  pEVar1->face = (Face *)0x0;
  pEVar2->face = (Face *)0x0;
  *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) + 1;
  if (*(int *)(in_RDI + 0xb4) < *(int *)(in_RDI + 0xb0)) {
    *(undefined4 *)(in_RDI + 0xb4) = *(undefined4 *)(in_RDI + 0xb0);
  }
  return pEVar1;
}

Assistant:

btConvexHullInternal::Edge* btConvexHullInternal::newEdgePair(Vertex* from, Vertex* to)
{
	btAssert(from && to);
	Edge* e = edgePool.newObject();
	Edge* r = edgePool.newObject();
	e->reverse = r;
	r->reverse = e;
	e->copy = mergeStamp;
	r->copy = mergeStamp;
	e->target = to;
	r->target = from;
	e->face = NULL;
	r->face = NULL;
	usedEdgePairs++;
	if (usedEdgePairs > maxUsedEdgePairs)
	{
		maxUsedEdgePairs = usedEdgePairs;
	}
	return e;
}